

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O3

void __thiscall
Centaurus::CATNMachine<unsigned_char>::CATNMachine
          (CATNMachine<unsigned_char> *this,ATNMachine<unsigned_char> *atn)

{
  vector<int,_std::allocator<int>_> node_map;
  allocator_type local_2d;
  value_type_conflict local_2c;
  vector<int,_std::allocator<int>_> local_28;
  
  this->_vptr_CATNMachine = (_func_int **)&PTR__CATNMachine_0019d090;
  (this->m_nodes).
  super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).
  super__Vector_base<Centaurus::CATNNode<unsigned_char>,_std::allocator<Centaurus::CATNNode<unsigned_char>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2c = -1;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_28,
             (long)((int)((ulong)((long)(atn->m_nodes).
                                        super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(atn->m_nodes).
                                       super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x286bca1b
                   ),&local_2c,&local_2d);
  import_atn_node(this,atn,0,-1,&local_28,0);
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

CATNMachine(const ATNMachine<TCHAR>& atn)
    {
        std::vector<int> node_map(atn.get_node_num(), -1);

        import_atn_node(atn, 0, -1, node_map, 0);
    }